

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O3

void __thiscall
supermap::BST<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::add
          (BST<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,Key<1UL> *key,
          ByteArray<1UL> *value)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  mapped_type *pmVar3;
  
  pmVar3 = std::
           map<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_std::less<supermap::Key<1UL>_>,_std::allocator<std::pair<const_supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
           ::operator[](&this->map_,key);
  _Var1._M_head_impl =
       (value->data_)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (value->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  _Var2._M_head_impl =
       (pmVar3->data_)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (pmVar3->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (uchar *)0x0) {
    operator_delete__(_Var2._M_head_impl);
    return;
  }
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        map_[key] = std::move(value);
    }